

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O2

void __thiscall
duckdb::RLEScanState<duckdb::uhugeint_t>::SkipInternal
          (RLEScanState<duckdb::uhugeint_t> *this,rle_count_t *index_pointer,idx_t skip_count)

{
  ushort uVar1;
  idx_t iVar2;
  ulong uVar3;
  ulong uVar4;
  
  iVar2 = this->entry_pos;
  uVar3 = this->position_in_entry;
  while (skip_count != 0) {
    uVar1 = index_pointer[iVar2];
    uVar4 = uVar1 - uVar3;
    if (skip_count < uVar4) {
      uVar4 = skip_count;
    }
    skip_count = skip_count - uVar4;
    uVar3 = uVar3 + uVar4;
    this->position_in_entry = uVar3;
    if (uVar1 <= uVar3) {
      iVar2 = iVar2 + 1;
      this->entry_pos = iVar2;
      this->position_in_entry = 0;
      uVar3 = 0;
    }
  }
  return;
}

Assistant:

inline void SkipInternal(rle_count_t *index_pointer, idx_t skip_count) {
		while (skip_count > 0) {
			rle_count_t run_end = index_pointer[entry_pos];
			idx_t skip_amount = MinValue<idx_t>(skip_count, run_end - position_in_entry);

			skip_count -= skip_amount;
			position_in_entry += skip_amount;
			if (ExhaustedRun(index_pointer)) {
				ForwardToNextRun();
			}
		}
	}